

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-embed.c
# Opt level: O0

int run_test_embed(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined1 local_358 [8];
  uv_loop_t external;
  
  iVar1 = uv_loop_init((uv_loop_t *)local_358);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-embed.c"
            ,0x72,"0 == uv_loop_init(&external)");
    abort();
  }
  embed_timer_called = 0;
  embed_closed = 0;
  uv_async_init((uv_loop_t *)local_358,&embed_async,embed_cb);
  loop = uv_default_loop();
  uv_timer_init(loop,&embed_timer);
  uv_timer_start(&embed_timer,embed_timer_cb,0xfa,0);
  uv_sem_init(&embed_sem,0);
  uv_thread_create(&embed_thread,embed_thread_runner,(void *)0x0);
  uv_run((uv_loop_t *)local_358,UV_RUN_DEFAULT);
  uv_thread_join(&embed_thread);
  uv_loop_close((uv_loop_t *)local_358);
  if (embed_timer_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-embed.c"
            ,0x87,"embed_timer_called == 1");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(embed) {
#if defined(HAVE_KQUEUE) || defined(HAVE_EPOLL)
  uv_loop_t external;

  ASSERT(0 == uv_loop_init(&external));

  embed_timer_called = 0;
  embed_closed = 0;

  uv_async_init(&external, &embed_async, embed_cb);

  /* Start timer in default loop */
  uv_timer_init(uv_default_loop(), &embed_timer);
  uv_timer_start(&embed_timer, embed_timer_cb, 250, 0);

  /* Start worker that will interrupt external loop */
  uv_sem_init(&embed_sem, 0);
  uv_thread_create(&embed_thread, embed_thread_runner, NULL);

  /* But run external loop */
  uv_run(&external, UV_RUN_DEFAULT);

  uv_thread_join(&embed_thread);
  uv_loop_close(&external);

  ASSERT(embed_timer_called == 1);
#endif

  return 0;
}